

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-fuzz-lattices.cpp
# Opt level: O0

Element __thiscall wasm::RandomFullLattice::makeElement(RandomFullLattice *this)

{
  bool bVar1;
  uint32_t uVar2;
  pointer pLVar3;
  add_pointer_t<wasm::analysis::Bool> ptVar4;
  add_pointer_t<wasm::analysis::Integer<unsigned_int>_> ptVar5;
  add_pointer_t<wasm::analysis::ValType> ptVar6;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *extraout_RDX_04;
  void *extraout_RDX_05;
  _Head_base<0UL,_void_*,_false> _Var7;
  undefined8 *in_RSI;
  Element EVar8;
  RandomFullLattice local_268;
  RandomFullLattice local_258;
  tuple<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::RandomElement<wasm::RandomFullLattice>_>
  local_248;
  ElementImpl local_228;
  add_pointer_t<wasm::analysis::Tuple<wasm::RandomFullLattice,_wasm::RandomFullLattice>_> local_200;
  type *l_3;
  RandomFullLattice local_1d0;
  _Head_base<1UL,_void_(*)(void_*),_false> local_1c0;
  size_t i;
  vector<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>
  elem;
  type *l_2;
  RandomFullLattice local_188;
  ElementImpl local_178;
  add_pointer_t<wasm::analysis::Array<wasm::RandomFullLattice,_2UL>_> local_150;
  type *l_1;
  ElementImpl local_138;
  add_pointer_t<wasm::analysis::Inverted<wasm::RandomFullLattice>_> local_110;
  type *l;
  HeapType local_e0;
  Type local_d8;
  HeapType local_d0;
  Type local_c8;
  HeapType local_c0;
  Type local_b8;
  HeapType local_b0;
  Type local_a8;
  Type local_a0;
  Type local_98;
  Type local_90;
  Type local_88;
  Type local_80;
  Type type;
  ElementImpl local_70;
  bool local_41;
  ElementImpl local_40;
  RandomFullLattice *this_local;
  
  this_local = this;
  pLVar3 = std::
           unique_ptr<wasm::RandomFullLattice::LatticeImpl,_std::default_delete<wasm::RandomFullLattice::LatticeImpl>_>
           ::get((unique_ptr<wasm::RandomFullLattice::LatticeImpl,_std::default_delete<wasm::RandomFullLattice::LatticeImpl>_>
                  *)(in_RSI + 1));
  ptVar4 = std::
           get_if<wasm::analysis::Bool,wasm::analysis::Bool,wasm::analysis::Integer<unsigned_int>,wasm::analysis::ValType,wasm::analysis::Inverted<wasm::RandomFullLattice>,wasm::analysis::Array<wasm::RandomFullLattice,2ul>,wasm::analysis::Vector<wasm::RandomFullLattice>,wasm::analysis::Tuple<wasm::RandomFullLattice,wasm::RandomFullLattice>>
                     (&pLVar3->super_FullLatticeVariant);
  if (ptVar4 == (add_pointer_t<wasm::analysis::Bool>)0x0) {
    pLVar3 = std::
             unique_ptr<wasm::RandomFullLattice::LatticeImpl,_std::default_delete<wasm::RandomFullLattice::LatticeImpl>_>
             ::get((unique_ptr<wasm::RandomFullLattice::LatticeImpl,_std::default_delete<wasm::RandomFullLattice::LatticeImpl>_>
                    *)(in_RSI + 1));
    ptVar5 = std::
             get_if<wasm::analysis::Integer<unsigned_int>,wasm::analysis::Bool,wasm::analysis::Integer<unsigned_int>,wasm::analysis::ValType,wasm::analysis::Inverted<wasm::RandomFullLattice>,wasm::analysis::Array<wasm::RandomFullLattice,2ul>,wasm::analysis::Vector<wasm::RandomFullLattice>,wasm::analysis::Tuple<wasm::RandomFullLattice,wasm::RandomFullLattice>>
                       (&pLVar3->super_FullLatticeVariant);
    if (ptVar5 == (add_pointer_t<wasm::analysis::Integer<unsigned_int>_>)0x0) {
      pLVar3 = std::
               unique_ptr<wasm::RandomFullLattice::LatticeImpl,_std::default_delete<wasm::RandomFullLattice::LatticeImpl>_>
               ::get((unique_ptr<wasm::RandomFullLattice::LatticeImpl,_std::default_delete<wasm::RandomFullLattice::LatticeImpl>_>
                      *)(in_RSI + 1));
      ptVar6 = std::
               get_if<wasm::analysis::ValType,wasm::analysis::Bool,wasm::analysis::Integer<unsigned_int>,wasm::analysis::ValType,wasm::analysis::Inverted<wasm::RandomFullLattice>,wasm::analysis::Array<wasm::RandomFullLattice,2ul>,wasm::analysis::Vector<wasm::RandomFullLattice>,wasm::analysis::Tuple<wasm::RandomFullLattice,wasm::RandomFullLattice>>
                         (&pLVar3->super_FullLatticeVariant);
      if (ptVar6 == (add_pointer_t<wasm::analysis::ValType>)0x0) {
        pLVar3 = std::
                 unique_ptr<wasm::RandomFullLattice::LatticeImpl,_std::default_delete<wasm::RandomFullLattice::LatticeImpl>_>
                 ::get((unique_ptr<wasm::RandomFullLattice::LatticeImpl,_std::default_delete<wasm::RandomFullLattice::LatticeImpl>_>
                        *)(in_RSI + 1));
        local_110 = std::
                    get_if<wasm::analysis::Inverted<wasm::RandomFullLattice>,wasm::analysis::Bool,wasm::analysis::Integer<unsigned_int>,wasm::analysis::ValType,wasm::analysis::Inverted<wasm::RandomFullLattice>,wasm::analysis::Array<wasm::RandomFullLattice,2ul>,wasm::analysis::Vector<wasm::RandomFullLattice>,wasm::analysis::Tuple<wasm::RandomFullLattice,wasm::RandomFullLattice>>
                              (&pLVar3->super_FullLatticeVariant);
        if (local_110 == (add_pointer_t<wasm::analysis::Inverted<wasm::RandomFullLattice>_>)0x0) {
          pLVar3 = std::
                   unique_ptr<wasm::RandomFullLattice::LatticeImpl,_std::default_delete<wasm::RandomFullLattice::LatticeImpl>_>
                   ::get((unique_ptr<wasm::RandomFullLattice::LatticeImpl,_std::default_delete<wasm::RandomFullLattice::LatticeImpl>_>
                          *)(in_RSI + 1));
          local_150 = std::
                      get_if<wasm::analysis::Array<wasm::RandomFullLattice,2ul>,wasm::analysis::Bool,wasm::analysis::Integer<unsigned_int>,wasm::analysis::ValType,wasm::analysis::Inverted<wasm::RandomFullLattice>,wasm::analysis::Array<wasm::RandomFullLattice,2ul>,wasm::analysis::Vector<wasm::RandomFullLattice>,wasm::analysis::Tuple<wasm::RandomFullLattice,wasm::RandomFullLattice>>
                                (&pLVar3->super_FullLatticeVariant);
          if (local_150 == (add_pointer_t<wasm::analysis::Array<wasm::RandomFullLattice,_2UL>_>)0x0)
          {
            pLVar3 = std::
                     unique_ptr<wasm::RandomFullLattice::LatticeImpl,_std::default_delete<wasm::RandomFullLattice::LatticeImpl>_>
                     ::get((unique_ptr<wasm::RandomFullLattice::LatticeImpl,_std::default_delete<wasm::RandomFullLattice::LatticeImpl>_>
                            *)(in_RSI + 1));
            elem.
            super__Vector_base<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 (pointer)std::
                          get_if<wasm::analysis::Vector<wasm::RandomFullLattice>,wasm::analysis::Bool,wasm::analysis::Integer<unsigned_int>,wasm::analysis::ValType,wasm::analysis::Inverted<wasm::RandomFullLattice>,wasm::analysis::Array<wasm::RandomFullLattice,2ul>,wasm::analysis::Vector<wasm::RandomFullLattice>,wasm::analysis::Tuple<wasm::RandomFullLattice,wasm::RandomFullLattice>>
                                    (&pLVar3->super_FullLatticeVariant);
            if ((add_pointer_t<wasm::analysis::Vector<wasm::RandomFullLattice>_>)
                elem.
                super__Vector_base<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage ==
                (add_pointer_t<wasm::analysis::Vector<wasm::RandomFullLattice>_>)0x0) {
              pLVar3 = std::
                       unique_ptr<wasm::RandomFullLattice::LatticeImpl,_std::default_delete<wasm::RandomFullLattice::LatticeImpl>_>
                       ::get((unique_ptr<wasm::RandomFullLattice::LatticeImpl,_std::default_delete<wasm::RandomFullLattice::LatticeImpl>_>
                              *)(in_RSI + 1));
              local_200 = std::
                          get_if<wasm::analysis::Tuple<wasm::RandomFullLattice,wasm::RandomFullLattice>,wasm::analysis::Bool,wasm::analysis::Integer<unsigned_int>,wasm::analysis::ValType,wasm::analysis::Inverted<wasm::RandomFullLattice>,wasm::analysis::Array<wasm::RandomFullLattice,2ul>,wasm::analysis::Vector<wasm::RandomFullLattice>,wasm::analysis::Tuple<wasm::RandomFullLattice,wasm::RandomFullLattice>>
                                    (&pLVar3->super_FullLatticeVariant);
              if (local_200 ==
                  (add_pointer_t<wasm::analysis::Tuple<wasm::RandomFullLattice,_wasm::RandomFullLattice>_>
                   )0x0) {
                wasm::handle_unreachable
                          ("unexpected lattice",
                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-fuzz-lattices.cpp"
                           ,0x153);
              }
              std::get<0ul,wasm::RandomFullLattice,wasm::RandomFullLattice>(&local_200->lattices);
              makeElement(&local_258);
              std::get<1ul,wasm::RandomFullLattice,wasm::RandomFullLattice>(&local_200->lattices);
              makeElement(&local_268);
              std::
              tuple<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::RandomElement<wasm::RandomFullLattice>_>
              ::
              tuple<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::RandomElement<wasm::RandomFullLattice>,_true>
                        (&local_248,(RandomElement<wasm::RandomFullLattice> *)&local_258,
                         (RandomElement<wasm::RandomFullLattice> *)&local_268);
              std::
              variant<bool,unsigned_int,wasm::Type,wasm::RandomElement<wasm::RandomFullLattice>,std::array<wasm::RandomElement<wasm::RandomFullLattice>,2ul>,std::vector<wasm::RandomElement<wasm::RandomFullLattice>,std::allocator<wasm::RandomElement<wasm::RandomFullLattice>>>,std::tuple<wasm::RandomElement<wasm::RandomFullLattice>,wasm::RandomElement<wasm::RandomFullLattice>>>
              ::
              variant<std::tuple<wasm::RandomElement<wasm::RandomFullLattice>,wasm::RandomElement<wasm::RandomFullLattice>>,void,void,std::tuple<wasm::RandomElement<wasm::RandomFullLattice>,wasm::RandomElement<wasm::RandomFullLattice>>,void>
                        ((variant<bool,unsigned_int,wasm::Type,wasm::RandomElement<wasm::RandomFullLattice>,std::array<wasm::RandomElement<wasm::RandomFullLattice>,2ul>,std::vector<wasm::RandomElement<wasm::RandomFullLattice>,std::allocator<wasm::RandomElement<wasm::RandomFullLattice>>>,std::tuple<wasm::RandomElement<wasm::RandomFullLattice>,wasm::RandomElement<wasm::RandomFullLattice>>>
                          *)&local_228,&local_248);
              RandomElement<wasm::RandomFullLattice>::RandomElement
                        ((RandomElement<wasm::RandomFullLattice> *)this,&local_228);
              ElementImpl::~ElementImpl(&local_228);
              std::
              tuple<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::RandomElement<wasm::RandomFullLattice>_>
              ::~tuple(&local_248);
              RandomElement<wasm::RandomFullLattice>::~RandomElement
                        ((RandomElement<wasm::RandomFullLattice> *)&local_268);
              RandomElement<wasm::RandomFullLattice>::~RandomElement
                        ((RandomElement<wasm::RandomFullLattice> *)&local_258);
              _Var7._M_head_impl = extraout_RDX_05;
            }
            else {
              std::
              vector<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>
              ::vector((vector<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>
                        *)&i);
              std::
              vector<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>
              ::reserve((vector<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>
                         *)&i,(size_type)
                              elem.
                              super__Vector_base<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage[1].
                              super_unique_ptr<void,_void_(*)(void_*)>._M_t.
                              super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
                              super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.
                              super__Tuple_impl<1UL,_void_(*)(void_*)>.
                              super__Head_base<1UL,_void_(*)(void_*),_false>);
              for (local_1c0._M_head_impl = (_func_void_void_ptr *)0x0;
                  local_1c0._M_head_impl <
                  (_func_void_void_ptr *)
                  elem.
                  super__Vector_base<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage[1].
                  super_unique_ptr<void,_void_(*)(void_*)>._M_t.
                  super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
                  super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.
                  super__Tuple_impl<1UL,_void_(*)(void_*)>.
                  super__Head_base<1UL,_void_(*)(void_*),_false>;
                  local_1c0._M_head_impl = local_1c0._M_head_impl + 1) {
                makeElement(&local_1d0);
                std::
                vector<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>
                ::push_back((vector<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>
                             *)&i,(value_type *)&local_1d0);
                RandomElement<wasm::RandomFullLattice>::~RandomElement
                          ((RandomElement<wasm::RandomFullLattice> *)&local_1d0);
              }
              std::
              variant<bool,unsigned_int,wasm::Type,wasm::RandomElement<wasm::RandomFullLattice>,std::array<wasm::RandomElement<wasm::RandomFullLattice>,2ul>,std::vector<wasm::RandomElement<wasm::RandomFullLattice>,std::allocator<wasm::RandomElement<wasm::RandomFullLattice>>>,std::tuple<wasm::RandomElement<wasm::RandomFullLattice>,wasm::RandomElement<wasm::RandomFullLattice>>>
              ::
              variant<std::vector<wasm::RandomElement<wasm::RandomFullLattice>,std::allocator<wasm::RandomElement<wasm::RandomFullLattice>>>,void,void,std::vector<wasm::RandomElement<wasm::RandomFullLattice>,std::allocator<wasm::RandomElement<wasm::RandomFullLattice>>>,void>
                        ((variant<bool,unsigned_int,wasm::Type,wasm::RandomElement<wasm::RandomFullLattice>,std::array<wasm::RandomElement<wasm::RandomFullLattice>,2ul>,std::vector<wasm::RandomElement<wasm::RandomFullLattice>,std::allocator<wasm::RandomElement<wasm::RandomFullLattice>>>,std::tuple<wasm::RandomElement<wasm::RandomFullLattice>,wasm::RandomElement<wasm::RandomFullLattice>>>
                          *)&l_3,(vector<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>
                                  *)&i);
              RandomElement<wasm::RandomFullLattice>::RandomElement
                        ((RandomElement<wasm::RandomFullLattice> *)this,(ElementImpl *)&l_3);
              ElementImpl::~ElementImpl((ElementImpl *)&l_3);
              std::
              vector<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>
              ::~vector((vector<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>
                         *)&i);
              _Var7._M_head_impl = extraout_RDX_04;
            }
          }
          else {
            makeElement((RandomFullLattice *)&l_2);
            makeElement(&local_188);
            std::
            variant<bool,unsigned_int,wasm::Type,wasm::RandomElement<wasm::RandomFullLattice>,std::array<wasm::RandomElement<wasm::RandomFullLattice>,2ul>,std::vector<wasm::RandomElement<wasm::RandomFullLattice>,std::allocator<wasm::RandomElement<wasm::RandomFullLattice>>>,std::tuple<wasm::RandomElement<wasm::RandomFullLattice>,wasm::RandomElement<wasm::RandomFullLattice>>>
            ::
            variant<std::array<wasm::RandomElement<wasm::RandomFullLattice>,2ul>,void,void,std::array<wasm::RandomElement<wasm::RandomFullLattice>,2ul>,void>
                      ((variant<bool,unsigned_int,wasm::Type,wasm::RandomElement<wasm::RandomFullLattice>,std::array<wasm::RandomElement<wasm::RandomFullLattice>,2ul>,std::vector<wasm::RandomElement<wasm::RandomFullLattice>,std::allocator<wasm::RandomElement<wasm::RandomFullLattice>>>,std::tuple<wasm::RandomElement<wasm::RandomFullLattice>,wasm::RandomElement<wasm::RandomFullLattice>>>
                        *)&local_178,
                       (array<wasm::RandomElement<wasm::RandomFullLattice>,_2UL> *)&l_2);
            RandomElement<wasm::RandomFullLattice>::RandomElement
                      ((RandomElement<wasm::RandomFullLattice> *)this,&local_178);
            ElementImpl::~ElementImpl(&local_178);
            std::array<wasm::RandomElement<wasm::RandomFullLattice>,_2UL>::~array
                      ((array<wasm::RandomElement<wasm::RandomFullLattice>,_2UL> *)&l_2);
            _Var7._M_head_impl = extraout_RDX_03;
          }
        }
        else {
          makeElement((RandomFullLattice *)&l_1);
          std::
          variant<bool,unsigned_int,wasm::Type,wasm::RandomElement<wasm::RandomFullLattice>,std::array<wasm::RandomElement<wasm::RandomFullLattice>,2ul>,std::vector<wasm::RandomElement<wasm::RandomFullLattice>,std::allocator<wasm::RandomElement<wasm::RandomFullLattice>>>,std::tuple<wasm::RandomElement<wasm::RandomFullLattice>,wasm::RandomElement<wasm::RandomFullLattice>>>
          ::
          variant<wasm::RandomElement<wasm::RandomFullLattice>,void,void,wasm::RandomElement<wasm::RandomFullLattice>,void>
                    ((variant<bool,unsigned_int,wasm::Type,wasm::RandomElement<wasm::RandomFullLattice>,std::array<wasm::RandomElement<wasm::RandomFullLattice>,2ul>,std::vector<wasm::RandomElement<wasm::RandomFullLattice>,std::allocator<wasm::RandomElement<wasm::RandomFullLattice>>>,std::tuple<wasm::RandomElement<wasm::RandomFullLattice>,wasm::RandomElement<wasm::RandomFullLattice>>>
                      *)&local_138,(RandomElement<wasm::RandomFullLattice> *)&l_1);
          RandomElement<wasm::RandomFullLattice>::RandomElement
                    ((RandomElement<wasm::RandomFullLattice> *)this,&local_138);
          ElementImpl::~ElementImpl(&local_138);
          RandomElement<wasm::RandomFullLattice>::~RandomElement
                    ((RandomElement<wasm::RandomFullLattice> *)&l_1);
          _Var7._M_head_impl = extraout_RDX_02;
        }
      }
      else {
        Type::Type(&local_80);
        uVar2 = Random::upTo((Random *)*in_RSI,8);
        switch(uVar2) {
        case 0:
          Type::Type(&local_88,unreachable);
          local_80.id = local_88.id;
          break;
        case 1:
          Type::Type(&local_90,none);
          local_80.id = local_90.id;
          break;
        case 2:
          Type::Type(&local_98,i32);
          local_80.id = local_98.id;
          break;
        case 3:
          Type::Type(&local_a0,f32);
          local_80.id = local_a0.id;
          break;
        case 4:
          HeapType::HeapType(&local_b0,any);
          bVar1 = Random::oneIn((Random *)*in_RSI,2);
          Type::Type(&local_a8,local_b0,(uint)bVar1,Inexact);
          local_80.id = local_a8.id;
          break;
        case 5:
          HeapType::HeapType(&local_c0,none);
          bVar1 = Random::oneIn((Random *)*in_RSI,2);
          Type::Type(&local_b8,local_c0,(uint)bVar1,Inexact);
          local_80.id = local_b8.id;
          break;
        case 6:
          HeapType::HeapType(&local_d0,struct_);
          bVar1 = Random::oneIn((Random *)*in_RSI,2);
          Type::Type(&local_c8,local_d0,(uint)bVar1,Inexact);
          local_80.id = local_c8.id;
          break;
        case 7:
          HeapType::HeapType(&local_e0,array);
          bVar1 = Random::oneIn((Random *)*in_RSI,2);
          Type::Type(&local_d8,local_e0,(uint)bVar1,Inexact);
          local_80.id = local_d8.id;
        }
        std::
        variant<bool,unsigned_int,wasm::Type,wasm::RandomElement<wasm::RandomFullLattice>,std::array<wasm::RandomElement<wasm::RandomFullLattice>,2ul>,std::vector<wasm::RandomElement<wasm::RandomFullLattice>,std::allocator<wasm::RandomElement<wasm::RandomFullLattice>>>,std::tuple<wasm::RandomElement<wasm::RandomFullLattice>,wasm::RandomElement<wasm::RandomFullLattice>>>
        ::variant<wasm::Type&,void,void,wasm::Type,void>
                  ((variant<bool,unsigned_int,wasm::Type,wasm::RandomElement<wasm::RandomFullLattice>,std::array<wasm::RandomElement<wasm::RandomFullLattice>,2ul>,std::vector<wasm::RandomElement<wasm::RandomFullLattice>,std::allocator<wasm::RandomElement<wasm::RandomFullLattice>>>,std::tuple<wasm::RandomElement<wasm::RandomFullLattice>,wasm::RandomElement<wasm::RandomFullLattice>>>
                    *)&l,&local_80);
        RandomElement<wasm::RandomFullLattice>::RandomElement
                  ((RandomElement<wasm::RandomFullLattice> *)this,(ElementImpl *)&l);
        ElementImpl::~ElementImpl((ElementImpl *)&l);
        _Var7._M_head_impl = extraout_RDX_01;
      }
    }
    else {
      type.id._4_4_ = Random::upToSquared((Random *)*in_RSI,0x21);
      std::
      variant<bool,unsigned_int,wasm::Type,wasm::RandomElement<wasm::RandomFullLattice>,std::array<wasm::RandomElement<wasm::RandomFullLattice>,2ul>,std::vector<wasm::RandomElement<wasm::RandomFullLattice>,std::allocator<wasm::RandomElement<wasm::RandomFullLattice>>>,std::tuple<wasm::RandomElement<wasm::RandomFullLattice>,wasm::RandomElement<wasm::RandomFullLattice>>>
      ::variant<unsigned_int,void,void,unsigned_int,void>
                ((variant<bool,unsigned_int,wasm::Type,wasm::RandomElement<wasm::RandomFullLattice>,std::array<wasm::RandomElement<wasm::RandomFullLattice>,2ul>,std::vector<wasm::RandomElement<wasm::RandomFullLattice>,std::allocator<wasm::RandomElement<wasm::RandomFullLattice>>>,std::tuple<wasm::RandomElement<wasm::RandomFullLattice>,wasm::RandomElement<wasm::RandomFullLattice>>>
                  *)&local_70,(uint *)((long)&type.id + 4));
      RandomElement<wasm::RandomFullLattice>::RandomElement
                ((RandomElement<wasm::RandomFullLattice> *)this,&local_70);
      ElementImpl::~ElementImpl(&local_70);
      _Var7._M_head_impl = extraout_RDX_00;
    }
  }
  else {
    local_41 = Random::pick<bool,bool>((Random *)*in_RSI,true,false);
    std::
    variant<bool,unsigned_int,wasm::Type,wasm::RandomElement<wasm::RandomFullLattice>,std::array<wasm::RandomElement<wasm::RandomFullLattice>,2ul>,std::vector<wasm::RandomElement<wasm::RandomFullLattice>,std::allocator<wasm::RandomElement<wasm::RandomFullLattice>>>,std::tuple<wasm::RandomElement<wasm::RandomFullLattice>,wasm::RandomElement<wasm::RandomFullLattice>>>
    ::variant<bool,void,void,bool,void>
              ((variant<bool,unsigned_int,wasm::Type,wasm::RandomElement<wasm::RandomFullLattice>,std::array<wasm::RandomElement<wasm::RandomFullLattice>,2ul>,std::vector<wasm::RandomElement<wasm::RandomFullLattice>,std::allocator<wasm::RandomElement<wasm::RandomFullLattice>>>,std::tuple<wasm::RandomElement<wasm::RandomFullLattice>,wasm::RandomElement<wasm::RandomFullLattice>>>
                *)&local_40,&local_41);
    RandomElement<wasm::RandomFullLattice>::RandomElement
              ((RandomElement<wasm::RandomFullLattice> *)this,&local_40);
    ElementImpl::~ElementImpl(&local_40);
    _Var7._M_head_impl = extraout_RDX;
  }
  EVar8.super_unique_ptr<void,_void_(*)(void_*)>._M_t.super___uniq_ptr_impl<void,_void_(*)(void_*)>.
  _M_t.super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.super__Head_base<0UL,_void_*,_false>.
  _M_head_impl = _Var7._M_head_impl;
  EVar8.super_unique_ptr<void,_void_(*)(void_*)>._M_t.super___uniq_ptr_impl<void,_void_(*)(void_*)>.
  _M_t.super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.super__Tuple_impl<1UL,_void_(*)(void_*)>.
  super__Head_base<1UL,_void_(*)(void_*),_false>._M_head_impl =
       (_Head_base<1UL,_void_(*)(void_*),_false>)(_Head_base<1UL,_void_(*)(void_*),_false>)this;
  return (Element)EVar8.super_unique_ptr<void,_void_(*)(void_*)>._M_t.
                  super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
                  super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>;
}

Assistant:

RandomFullLattice::Element RandomFullLattice::makeElement() const noexcept {
  if (std::get_if<Bool>(lattice.get())) {
    return ElementImpl{rand.pick(true, false)};
  }
  if (std::get_if<UInt32>(lattice.get())) {
    return ElementImpl{rand.upToSquared(33)};
  }
  if (std::get_if<ValType>(lattice.get())) {
    Type type;
    // Choose a random type. No need to make all possible types available as
    // long as we cover all the kinds of relationships between types.
    switch (rand.upTo(8)) {
      case 0:
        type = Type::unreachable;
        break;
      case 1:
        type = Type::none;
        break;
      case 2:
        type = Type::i32;
        break;
      case 3:
        type = Type::f32;
        break;
      case 4:
        type = Type(HeapType::any, rand.oneIn(2) ? Nullable : NonNullable);
        break;
      case 5:
        type = Type(HeapType::none, rand.oneIn(2) ? Nullable : NonNullable);
        break;
      case 6:
        type = Type(HeapType::struct_, rand.oneIn(2) ? Nullable : NonNullable);
        break;
      case 7:
        type = Type(HeapType::array, rand.oneIn(2) ? Nullable : NonNullable);
        break;
    }
    return ElementImpl{type};
  }
  if (const auto* l = std::get_if<Inverted<RandomFullLattice>>(lattice.get())) {
    return ElementImpl{l->lattice.makeElement()};
  }
  if (const auto* l = std::get_if<ArrayFullLattice>(lattice.get())) {
    return ElementImpl{typename ArrayFullLattice::Element{
      l->lattice.makeElement(), l->lattice.makeElement()}};
  }
  if (const auto* l = std::get_if<Vector<RandomFullLattice>>(lattice.get())) {
    std::vector<typename RandomFullLattice::Element> elem;
    elem.reserve(l->size);
    for (size_t i = 0; i < l->size; ++i) {
      elem.push_back(l->lattice.makeElement());
    }
    return ElementImpl{std::move(elem)};
  }
  if (const auto* l = std::get_if<TupleFullLattice>(lattice.get())) {
    return ElementImpl{typename TupleFullLattice::Element{
      std::get<0>(l->lattices).makeElement(),
      std::get<1>(l->lattices).makeElement()}};
  }
  WASM_UNREACHABLE("unexpected lattice");
}